

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O0

int secp256k1_range_proveparams
              (uint64_t *v,size_t *rings,size_t *rsizes,size_t *npub,size_t *secidx,
              uint64_t *min_value,int *mantissa,uint64_t *scale,int *exp,int *min_bits,
              uint64_t value)

{
  int iVar1;
  int local_7c;
  ulong local_68;
  int local_5c;
  ulong local_58;
  uint64_t v2;
  ulong uStack_48;
  int max_bits;
  size_t i;
  uint64_t *min_value_local;
  size_t *secidx_local;
  size_t *npub_local;
  size_t *rsizes_local;
  size_t *rings_local;
  uint64_t *v_local;
  
  *rings = 1;
  *rsizes = 1;
  *secidx = 0;
  *scale = 1;
  *mantissa = 0;
  *npub = 0;
  if (*min_value == 0xffffffffffffffff) {
    *exp = -1;
  }
  if (*exp < 0) {
    *exp = 0;
    *min_value = value;
    *v = 0;
    *npub = 2;
  }
  else {
    if (((*min_value != 0) && (0x7fffffffffffffff < value)) ||
       ((value != 0 && (0x7ffffffffffffffe < *min_value)))) {
      return 0;
    }
    if (*min_value == 0) {
      local_5c = 0x40;
    }
    else {
      local_5c = secp256k1_clz64_var(*min_value);
    }
    if (local_5c < *min_bits) {
      *min_bits = local_5c;
    }
    if ((0x3d < *min_bits) || (0x7fffffffffffffff < value)) {
      *exp = 0;
    }
    *v = value - *min_value;
    if (*min_bits == 0) {
      local_68 = 0;
    }
    else {
      local_68 = 0xffffffffffffffff >> (0x40U - (char)*min_bits & 0x3f);
    }
    local_58 = local_68;
    for (iVar1 = 0; iVar1 < *exp && local_58 < 0x199999999999999a; iVar1 = iVar1 + 1) {
      *v = *v / 10;
      local_58 = local_58 * 10;
    }
    *exp = iVar1;
    local_58 = *v;
    for (iVar1 = 0; iVar1 < *exp; iVar1 = iVar1 + 1) {
      local_58 = local_58 * 10;
      *scale = *scale * 10;
    }
    *min_value = value - local_58;
    if (*v == 0) {
      local_7c = 1;
    }
    else {
      local_7c = secp256k1_clz64_var(*v);
      local_7c = 0x40 - local_7c;
    }
    *mantissa = local_7c;
    if (*mantissa < *min_bits) {
      *mantissa = *min_bits;
    }
    *rings = (long)(*mantissa + 1 >> 1);
    for (uStack_48 = 0; uStack_48 < *rings; uStack_48 = uStack_48 + 1) {
      iVar1 = 2;
      if (uStack_48 < *rings - 1 || (*mantissa & 1U) == 0) {
        iVar1 = 4;
      }
      rsizes[uStack_48] = (long)iVar1;
      *npub = rsizes[uStack_48] + *npub;
      secidx[uStack_48] = *v >> ((byte)(uStack_48 << 1) & 0x3f) & 3;
    }
  }
  return 1;
}

Assistant:

SECP256K1_INLINE static int secp256k1_range_proveparams(uint64_t *v, size_t *rings, size_t *rsizes, size_t *npub, size_t *secidx, uint64_t *min_value,
 int *mantissa, uint64_t *scale,  int *exp, int *min_bits, uint64_t value) {
    size_t i;
    *rings = 1;
    rsizes[0] = 1;
    secidx[0] = 0;
    *scale = 1;
    *mantissa = 0;
    *npub = 0;
    if (*min_value == UINT64_MAX) {
        /* If the minimum value is the maximal representable value, then we cannot code a range. */
        *exp = -1;
    }
    if (*exp >= 0) {
        int max_bits;
        uint64_t v2;
        if ((*min_value && value > INT64_MAX) || (value && *min_value >= INT64_MAX)) {
            /* If either value or min_value is >= 2^63-1 then the other must by zero to avoid overflowing the proven range. */
            return 0;
        }
        max_bits = *min_value ? secp256k1_clz64_var(*min_value) : 64;
        if (*min_bits > max_bits) {
            *min_bits = max_bits;
        }
        if (*min_bits > 61 || value > INT64_MAX) {
            /** Ten is not a power of two, so dividing by ten and then representing in base-2 times ten
             *   expands the representable range. The verifier requires the proven range is within 0..2**64.
             *   For very large numbers (all over 2**63) we must change our exponent to compensate.
             *  Rather than handling it precisely, this just disables use of the exponent for big values.
             */
            *exp = 0;
        }
        /* Mask off the least significant digits, as requested. */
        *v = value - *min_value;
        /* If the user has asked for more bits of proof then there is room for in the exponent, reduce the exponent. */
        v2 = *min_bits ? (UINT64_MAX>>(64-*min_bits)) : 0;
        for (i = 0; (int) i < *exp && (v2 <= UINT64_MAX / 10); i++) {
            *v /= 10;
            v2 *= 10;
        }
        *exp = i;
        v2 = *v;
        for (i = 0; (int) i < *exp; i++) {
            v2 *= 10;
            *scale *= 10;
        }
        /* If the masked number isn't precise, compute the public offset. */
        *min_value = value - v2;
        /* How many bits do we need to represent our value? */
        *mantissa = *v ? 64 - secp256k1_clz64_var(*v) : 1;
        if (*min_bits > *mantissa) {
            /* If the user asked for more precision, give it to them. */
            *mantissa = *min_bits;
        }
        /* Digits in radix-4, except for the last digit if our mantissa length is odd. */
        *rings = (*mantissa + 1) >> 1;
        for (i = 0; i < *rings; i++) {
            rsizes[i] = ((i < *rings - 1) | (!(*mantissa&1))) ? 4 : 2;
            *npub += rsizes[i];
            secidx[i] = (*v >> (i*2)) & 3;
        }
        VERIFY_CHECK(*mantissa>0);
        VERIFY_CHECK((*v & ~(UINT64_MAX>>(64-*mantissa))) == 0); /* Did this get all the bits? */
    } else {
        /* A proof for an exact value. */
        *exp = 0;
        *min_value = value;
        *v = 0;
        *npub = 2;
    }
    VERIFY_CHECK(*v * *scale + *min_value == value);
    VERIFY_CHECK(*rings > 0);
    VERIFY_CHECK(*rings <= 32);
    VERIFY_CHECK(*npub <= 128);
    return 1;
}